

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.cpp
# Opt level: O3

string * RdbufMove(string *__return_storage_ptr__,string *FileName)

{
  ostringstream Results;
  ifstream ResultReader;
  size_type *local_3a8;
  size_type local_3a0;
  size_type local_398;
  undefined8 uStack_390;
  ostringstream local_388 [112];
  ios_base local_318 [264];
  undefined1 local_210 [16];
  streambuf local_200 [504];
  
  std::ifstream::ifstream(local_210,(string *)FileName,_S_in);
  std::__cxx11::ostringstream::ostringstream(local_388);
  std::ostream::operator<<((ostream *)local_388,local_200);
  std::__cxx11::stringbuf::str();
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  if (local_3a8 == &local_398) {
    (__return_storage_ptr__->field_2)._M_allocated_capacity = local_398;
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uStack_390;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_3a8;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = local_398;
  }
  __return_storage_ptr__->_M_string_length = local_3a0;
  std::__cxx11::ostringstream::~ostringstream(local_388);
  std::ios_base::~ios_base(local_318);
  std::ifstream::~ifstream(local_210);
  return __return_storage_ptr__;
}

Assistant:

std::string RdbufMove(std::string FileName)
{
    std::ifstream ResultReader(FileName);
    std::ostringstream Results;
    Results << ResultReader.rdbuf();
    return std::move(Results.str());
}